

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint32_t __thiscall Cache::log2i(Cache *this,uint32_t val)

{
  uint32_t uVar1;
  
  if (val == 0) {
    return 0xffffffff;
  }
  uVar1 = 0;
  if (val != 1) {
    for (; 1 < val; val = val >> 1) {
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

uint32_t Cache::log2i(uint32_t val) {
  if (val == 0)
    return uint32_t(-1);
  if (val == 1)
    return 0;
  uint32_t ret = 0;
  while (val > 1) {
    val >>= 1;
    ret++;
  }
  return ret;
}